

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O2

void __thiscall
Js::AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)'_',_(unsigned_char)'\x03'>::
AuxPtrsFix(AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)___,_(unsigned_char)__x03_>
           *this,AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)__x10_,_(unsigned_char)__x01_>
                 *ptr16)

{
  byte bVar1;
  long lVar2;
  uint8 i;
  bool bVar3;
  ulong uVar4;
  
  this->ptr[0].ptr = (void *)0x0;
  this->ptr[1].ptr = (void *)0x0;
  this->ptr[2].ptr = (void *)0x0;
  this->count = '\x03';
  bVar3 = true;
  lVar2 = 0;
  while (bVar3) {
    this->type[lVar2] = ptr16->type[lVar2];
    Memory::WriteBarrierPtr<void>::operator=(this->ptr + lVar2,ptr16->ptr + lVar2);
    bVar3 = false;
    lVar2 = 1;
  }
  bVar1 = this->count;
  for (uVar4 = 1; uVar4 < bVar1; uVar4 = uVar4 + 1) {
    this->type[uVar4] = Invalid;
  }
  return;
}

Assistant:

AuxPtrsFix<FieldsEnum, size, _MaxCount>::AuxPtrsFix(AuxPtrsFix<FieldsEnum, 16>* ptr16)
    {
        static_assert(_MaxCount == AuxPtrsFix<FieldsEnum, 32>::MaxCount, "Should only be called on AuxPtrsFix<FieldsEnum, 32>");
        this->count = AuxPtrsFix<FieldsEnum, 32>::MaxCount;
        for (uint8 i = 0; i < AuxPtrsFix<FieldsEnum, 16>::MaxCount; i++)
        {
            this->type[i] = ptr16->type[i];
            this->ptr[i] = ptr16->ptr[i];
        }
        for (uint8 i = AuxPtrsFix<FieldsEnum, 16>::MaxCount; i < count; i++)
        {
            this->type[i] = FieldsEnum::Invalid;
        }
    }